

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O1

void __thiscall
IntrusiveListTest_move_assignment_operator_Test::TestBody
          (IntrusiveListTest_move_assignment_operator_Test *this)

{
  TestObject *pTVar1;
  _func_int **pp_Var2;
  TestObject *pTVar3;
  vector<int,_std::allocator<int>_> *data_values;
  vector<int,_std::allocator<int>_> *expected;
  vector<int,_std::allocator<int>_> *expected_00;
  TestObjectList list1;
  TestObjectList local_88;
  IntrusiveListTest local_68;
  GTestFlagSaver *local_58;
  TestObjectList local_48;
  
  local_58 = (GTestFlagSaver *)0x0;
  local_68.super_Test._vptr_Test = (_func_int **)0x0;
  local_68.super_Test.gtest_flag_saver_.ptr_ = (GTestFlagSaver *)0x0;
  pp_Var2 = (_func_int **)operator_new(0xc);
  local_68.super_Test.gtest_flag_saver_.ptr_ = (GTestFlagSaver *)((long)pp_Var2 + 0xc);
  *pp_Var2 = (_func_int *)&DAT_200000001;
  *(undefined4 *)(pp_Var2 + 1) = 3;
  local_68.super_Test._vptr_Test = pp_Var2;
  local_58 = local_68.super_Test.gtest_flag_saver_.ptr_;
  anon_unknown.dwarf_7b76a::IntrusiveListTest::NewList(&local_48,&local_68,data_values);
  operator_delete(pp_Var2);
  pTVar1 = local_48.first_;
  local_68.super_Test._vptr_Test = (_func_int **)local_48.first_;
  local_68.super_Test.gtest_flag_saver_.ptr_ = (GTestFlagSaver *)local_48.last_;
  local_58 = (GTestFlagSaver *)local_48.size_;
  local_48.first_ = (TestObject *)0x0;
  local_48.last_ = (TestObject *)0x0;
  local_48.size_ = 0;
  local_88.size_ = 0;
  local_88.first_ = (TestObject *)0x0;
  local_88.last_ = (TestObject *)0x0;
  anon_unknown.dwarf_7b76a::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&local_48,&local_88,expected);
  local_88.size_ = 0;
  local_88.first_ = (TestObject *)0x0;
  local_88.last_ = (TestObject *)0x0;
  pTVar3 = (TestObject *)operator_new(0xc);
  local_88.last_ =
       (TestObject *)
       ((long)&(pTVar3->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ + 4);
  (pTVar3->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
       (TestObject *)&DAT_200000001;
  *(undefined4 *)&(pTVar3->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = 3;
  local_88.first_ = pTVar3;
  local_88.size_ = (size_t)local_88.last_;
  anon_unknown.dwarf_7b76a::IntrusiveListTest::AssertListEq(&local_68,&local_88,expected_00);
  operator_delete(pTVar3);
  while (pTVar3 = local_48.first_, pTVar1 != (TestObject *)0x0) {
    if (pTVar1->moved == false) {
      (anonymous_namespace)::TestObject::creation_count =
           (anonymous_namespace)::TestObject::creation_count + -1;
    }
    pTVar3 = (pTVar1->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
    operator_delete(pTVar1);
    pTVar1 = pTVar3;
  }
  while (pTVar3 != (TestObject *)0x0) {
    if (pTVar3->moved == false) {
      (anonymous_namespace)::TestObject::creation_count =
           (anonymous_namespace)::TestObject::creation_count + -1;
    }
    pTVar1 = (pTVar3->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
    operator_delete(pTVar3);
    pTVar3 = pTVar1;
  }
  return;
}

Assistant:

TEST_F(IntrusiveListTest, move_assignment_operator) {
  TestObjectList list1 = NewList({1, 2, 3});
  TestObjectList list2;

  list2 = std::move(list1);
  AssertListEq(list1, {});
  AssertListEq(list2, {1, 2, 3});
}